

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O1

void __thiscall Poll::loop(Poll *this)

{
  size_type sVar1;
  pollfd *__fds;
  pollfd pVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  const_iterator __position;
  int iVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  _Base_ptr p_Var9;
  pointer ppVar10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  Error *this_01;
  ulong uVar13;
  ulong uVar14;
  __node_base_ptr p_Var15;
  _Self __tmp;
  ulong uVar16;
  
  uVar7 = current_time_millis();
  if (this->shutdown == false) {
    do {
      sVar1 = (this->subs)._M_h._M_element_count;
      if (sVar1 == 0) {
        return;
      }
      if (sVar1 * 3 <
          (ulong)((long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        compact(this);
      }
      __fds = (pollfd *)
              (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
              super__Vector_impl_data._M_start;
      iVar6 = poll(__fds,(long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)__fds >> 3,100);
      iVar6 = no_err(iVar6,"error in poll");
      if ((iVar6 == 0) || (uVar8 = current_time_millis(), 100 < uVar8 - uVar7)) {
        uVar7 = current_time_millis();
        __position._M_node = (this->alarms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (((_Rb_tree_header *)__position._M_node !=
                &(this->alarms)._M_t._M_impl.super__Rb_tree_header &&
               (*(ulong *)(__position._M_node + 1) <= uVar7))) {
          Alarm::on_timeout((Alarm *)__position._M_node[1]._M_parent);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Alarm>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Alarm>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>>
                              *)&this->alarms,__position);
          __position._M_node = p_Var9;
        }
      }
      else {
        ppVar10 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
            super__Vector_impl_data._M_finish != ppVar10) {
          uVar16 = 0;
          do {
            pVar2 = ppVar10[uVar16];
            uVar14 = (ulong)pVar2 >> 0x30;
            if (uVar14 != 0) {
              iVar6 = pVar2.fd;
              uVar3 = (this->subs)._M_h._M_bucket_count;
              uVar13 = (ulong)(long)iVar6 % uVar3;
              p_Var4 = (this->subs)._M_h._M_buckets[uVar13];
              p_Var11 = (__node_base_ptr)0x0;
              if ((p_Var4 != (__node_base_ptr)0x0) &&
                 (p_Var11 = p_Var4, p_Var15 = p_Var4->_M_nxt,
                 *(int *)&p_Var4->_M_nxt[1]._M_nxt != iVar6)) {
                while (p_Var12 = p_Var15->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
                  p_Var11 = (__node_base_ptr)0x0;
                  if (((ulong)(long)*(int *)&p_Var12[1]._M_nxt % uVar3 != uVar13) ||
                     (p_Var11 = p_Var15, p_Var15 = p_Var12, *(int *)&p_Var12[1]._M_nxt == iVar6))
                  goto LAB_0010b2fa;
                }
                p_Var11 = (__node_base_ptr)0x0;
              }
LAB_0010b2fa:
              if (p_Var11 == (__node_base_ptr)0x0) {
                p_Var12 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var12 = p_Var11->_M_nxt;
              }
              if (p_Var12 == (_Hash_node_base *)0x0) {
                this_01 = (Error *)__cxa_allocate_exception(0x3f0);
                Error::Error(this_01,"No handler for fd %d",(ulong)pVar2 & 0xffffffff);
                __cxa_throw(this_01,&Error::typeinfo,std::exception::~exception);
              }
              p_Var5 = p_Var12[2]._M_nxt;
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var12[3]._M_nxt;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              if ((uVar14 & 1) != 0) {
                (*(code *)p_Var5->_M_nxt[1]._M_nxt)(p_Var5,this);
              }
              if ((uVar14 & 4) != 0) {
                (*(code *)p_Var5->_M_nxt[2]._M_nxt)(p_Var5,this);
              }
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
            }
            uVar16 = uVar16 + 1;
            ppVar10 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar16 < (ulong)((long)(this->fds).
                                          super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)ppVar10
                                   >> 3));
        }
      }
    } while (this->shutdown != true);
  }
  return;
}

Assistant:

void Poll::loop() {
  uint64_t time = current_time_millis();
  while (!this->shutdown && this->subs.size() > 0) {
    if (this->fds.size() > COMPACTION_THRESHOLD * this->subs.size())
      compact();
    int changed_fds = no_err(poll(&fds[0], fds.size(), WAIT_QUANTUM), "error in poll");
    if (changed_fds == 0 || current_time_millis() - time > WAIT_QUANTUM) { //Timeout occured
      time = current_time_millis();
      for (auto it = alarms.cbegin(); it != alarms.cend() && it->first <= time;) {
        it->second->on_timeout();
        alarms.erase(it++);
      }
      continue;
    }
    for (int i = 0; i < fds.size(); ++i) {
      auto fd = fds[i];
      if (fd.revents == 0) continue;
      auto listener_itr = this->subs.find(fd.fd);
      if (listener_itr == this->subs.end()) {
        throw Error("No handler for fd %d", fd.fd);
      }
      std::shared_ptr<Subscriber> listener = listener_itr->second;
      try {
        if (fd.revents & POLLIN) {
          listener->on_input(*this);
        }
        if (fd.revents & POLLOUT) {
          listener->on_output(*this);
        }
        if (fd.revents & !(POLLIN | POLLOUT)) {
          std::cout << "Error event from poll " << fd.revents << std::endl;
          listener->on_error(*this, fd.revents);
        }
      } catch (Error &e) {
        printf("Error in event loop %s listener=%s pollfd{ev=%d, fd=%d, revents=%d}\n",
               e.what(), &listener->get_name()[0], fd.events, fd.fd, fd.revents);
      }
    }
  }
}